

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcalendarwidget.cpp
# Opt level: O1

void QCalendarWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint *puVar1;
  long *plVar2;
  SelectionMode *pSVar3;
  long lVar4;
  undefined1 uVar5;
  uint uVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  QDate *pQVar9;
  int iVar10;
  int year;
  QDate date;
  QCalendarWidgetPrivate *this;
  long in_FS_OFFSET;
  undefined8 local_50;
  QDate local_48;
  undefined8 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    iVar10 = 0;
    pQVar9 = (QDate *)0x0;
    goto LAB_003d4a31;
  case 1:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    pQVar9 = &local_48;
    local_48.jd = 0;
    iVar10 = 1;
    goto LAB_003d4a31;
  case 2:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    pQVar9 = &local_48;
    local_48.jd = 0;
    iVar10 = 2;
LAB_003d4a31:
    QMetaObject::activate(_o,&staticMetaObject,iVar10,(void **)pQVar9);
    break;
  case 3:
    currentPageChanged((QCalendarWidget *)_o,*_a[1],*_a[2]);
    break;
  case 4:
    setSelectedDate((QCalendarWidget *)_o,(QDate)*_a[1]);
    break;
  case 5:
    setDateRange((QCalendarWidget *)_o,(QDate)*_a[1],(QDate)*_a[2]);
    break;
  case 6:
    year = *_a[1];
    iVar10 = *_a[2];
    goto LAB_003d4a9e;
  case 7:
    setGridVisible((QCalendarWidget *)_o,*_a[1]);
    break;
  case 8:
    setNavigationBarVisible((QCalendarWidget *)_o,*_a[1]);
    break;
  case 9:
    showNextMonth((QCalendarWidget *)_o);
    break;
  case 10:
    showPreviousMonth((QCalendarWidget *)_o);
    break;
  case 0xb:
    iVar10 = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0x3c);
    year = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0x38) + 1;
    goto LAB_003d4a9e;
  case 0xc:
    iVar10 = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0x3c);
    year = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0x38) + -1;
LAB_003d4a9e:
    setCurrentPage((QCalendarWidget *)_o,year,iVar10);
    break;
  case 0xd:
    showSelectedDate((QCalendarWidget *)_o);
    break;
  case 0xe:
    showToday((QCalendarWidget *)_o);
    break;
  case 0xf:
    QCalendarWidgetPrivate::updateCurrentPage(*(QCalendarWidgetPrivate **)(_o + 8),(QDate)*_a[1]);
    break;
  case 0x10:
    this = *(QCalendarWidgetPrivate **)(_o + 8);
    date.jd = *_a[1];
    uVar5 = true;
    goto LAB_003d4a4d;
  case 0x11:
    this = *(QCalendarWidgetPrivate **)(_o + 8);
    date.jd = *_a[1];
    uVar5 = *_a[2];
LAB_003d4a4d:
    QCalendarWidgetPrivate::_q_slotChangeDate(this,date,(bool)uVar5);
    break;
  case 0x12:
    QCalendarWidgetPrivate::_q_editingFinished(*(QCalendarWidgetPrivate **)(_o + 8));
    break;
  case 0x13:
    QCalendarWidgetPrivate::_q_prevMonthClicked(*(QCalendarWidgetPrivate **)(_o + 8));
    break;
  case 0x14:
    QCalendarWidgetPrivate::_q_nextMonthClicked(*(QCalendarWidgetPrivate **)(_o + 8));
    break;
  case 0x15:
    QCalendarWidgetPrivate::_q_yearEditingFinished(*(QCalendarWidgetPrivate **)(_o + 8));
    break;
  case 0x16:
    QCalendarWidgetPrivate::_q_yearClicked(*(QCalendarWidgetPrivate **)(_o + 8));
    break;
  case 0x17:
    QCalendarWidgetPrivate::_q_monthChanged(*(QCalendarWidgetPrivate **)(_o + 8),*_a[1]);
  }
  switch(_c) {
  case ReadProperty:
switchD_003d48d8_caseD_1:
    if (10 < (uint)_id) goto LAB_003d4ccb;
    break;
  case WriteProperty:
    goto switchD_003d48d8_caseD_2;
  default:
    goto switchD_003d4b0f_caseD_3;
  case IndexOfMethod:
switchD_003d48d8_caseD_5:
    plVar2 = (long *)_a[1];
    if (((code *)*plVar2 == selectionChanged) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_003d48d8_caseD_4;
    }
    if (((code *)*plVar2 == clicked) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_003d48d8_caseD_4;
    }
    if (((code *)*plVar2 == activated) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_003d48d8_caseD_4;
    }
    if (((code *)*plVar2 == currentPageChanged) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_003d48d8_caseD_4;
    }
    if (_c == ResetProperty) goto switchD_003d48d8_caseD_3;
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_003d48d8_caseD_4;
      goto switchD_003d48d8_caseD_1;
    }
    goto switchD_003d48d8_caseD_2;
  case RegisterMethodArgumentMetaType:
    if (_id == 0x17) {
      puVar7 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_003d4b32;
      *puVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
    }
    else {
      puVar7 = (undefined8 *)*_a;
LAB_003d4b32:
      *puVar7 = 0;
    }
    switch(_c) {
    case ReadProperty:
      goto switchD_003d48d8_caseD_1;
    case WriteProperty:
      goto switchD_003d48d8_caseD_2;
    case ResetProperty:
      goto switchD_003d48d8_caseD_3;
    default:
      goto switchD_003d48d8_caseD_4;
    case IndexOfMethod:
      goto switchD_003d48d8_caseD_5;
    }
  }
  puVar1 = (uint *)*_a;
  switch(_id) {
  case 0:
    uVar8 = *(undefined8 *)(*(long *)(*(long *)(_o + 8) + 600) + 0x20);
    goto LAB_003d4c7f;
  case 1:
    uVar8 = *(undefined8 *)(*(long *)(*(long *)(_o + 8) + 600) + 0x28);
    goto LAB_003d4c7f;
  case 2:
    uVar8 = *(undefined8 *)(*(long *)(*(long *)(_o + 8) + 600) + 0x30);
LAB_003d4c7f:
    *(undefined8 *)puVar1 = uVar8;
    goto LAB_003d4ccb;
  case 3:
    uVar6 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x40);
    break;
  case 4:
    uVar5 = QTableView::showGrid(*(QTableView **)(*(long *)(_o + 8) + 0x260));
    goto LAB_003d4cc7;
  case 5:
    uVar6 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x28) ^ 1;
    break;
  case 6:
    uVar6 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x44);
    break;
  case 7:
    uVar6 = (uint)*(byte *)(*(long *)(*(long *)(_o + 8) + 600) + 0x48);
    break;
  case 8:
    uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x2d0);
    goto LAB_003d4cc7;
  case 9:
    uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x280);
LAB_003d4cc7:
    *(undefined1 *)puVar1 = uVar5;
    goto LAB_003d4ccb;
  case 10:
    uVar6 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x278) + 0x38);
  }
  *puVar1 = uVar6;
LAB_003d4ccb:
  if (_c != ResetProperty) {
    if (_c != WriteProperty) goto switchD_003d48d8_caseD_4;
switchD_003d48d8_caseD_2:
    if ((uint)_id < 0xb) {
      pSVar3 = (SelectionMode *)*_a;
      switch(_id) {
      case 0:
        setSelectedDate((QCalendarWidget *)_o,(QDate)*(qint64 *)pSVar3);
        break;
      case 1:
        setMinimumDate((QCalendarWidget *)_o,(QDate)*(qint64 *)pSVar3);
        break;
      case 2:
        setMaximumDate((QCalendarWidget *)_o,(QDate)*(qint64 *)pSVar3);
        break;
      case 3:
        setFirstDayOfWeek((QCalendarWidget *)_o,*pSVar3);
        break;
      case 4:
        setGridVisible((QCalendarWidget *)_o,SUB41(*pSVar3,0));
        break;
      case 5:
        setSelectionMode((QCalendarWidget *)_o,*pSVar3);
        break;
      case 6:
        setHorizontalHeaderFormat((QCalendarWidget *)_o,*pSVar3);
        break;
      case 7:
        setVerticalHeaderFormat((QCalendarWidget *)_o,*pSVar3);
        break;
      case 8:
        lVar4 = *(long *)(_o + 8);
        *(char *)(lVar4 + 0x2d0) = (char)*pSVar3;
        *(undefined8 *)(lVar4 + 0x2d4) = 0xffffffffffffffff;
        (**(code **)(**(long **)(lVar4 + 0x2c0) + 0x68))();
        QWidget::updateGeometry((QWidget *)_o);
        break;
      case 9:
        setDateEditEnabled((QCalendarWidget *)_o,SUB41(*pSVar3,0));
        break;
      case 10:
        *(SelectionMode *)(*(long *)(*(long *)(_o + 8) + 0x278) + 0x38) = *pSVar3;
      }
    }
switchD_003d4b0f_caseD_3:
    if (_c != ResetProperty) goto switchD_003d48d8_caseD_4;
  }
switchD_003d48d8_caseD_3:
  if (_id == 2) {
    QDate::QDate(&local_48,9999,0xc,0x1f);
    setMaximumDate((QCalendarWidget *)_o,local_48);
  }
  else if (_id == 1) {
    setMinimumDate((QCalendarWidget *)_o,(QDate)0x1);
  }
switchD_003d48d8_caseD_4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCalendarWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectionChanged(); break;
        case 1: _t->clicked((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 2: _t->activated((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->currentPageChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->setSelectedDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->setDateRange((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDate>>(_a[2]))); break;
        case 6: _t->setCurrentPage((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 7: _t->setGridVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setNavigationBarVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 9: _t->showNextMonth(); break;
        case 10: _t->showPreviousMonth(); break;
        case 11: _t->showNextYear(); break;
        case 12: _t->showPreviousYear(); break;
        case 13: _t->showSelectedDate(); break;
        case 14: _t->showToday(); break;
        case 15: _t->d_func()->_q_slotShowDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 16: _t->d_func()->_q_slotChangeDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 17: _t->d_func()->_q_slotChangeDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 18: _t->d_func()->_q_editingFinished(); break;
        case 19: _t->d_func()->_q_prevMonthClicked(); break;
        case 20: _t->d_func()->_q_nextMonthClicked(); break;
        case 21: _t->d_func()->_q_yearEditingFinished(); break;
        case 22: _t->d_func()->_q_yearClicked(); break;
        case 23: _t->d_func()->_q_monthChanged((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 23:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)()>(_a, &QCalendarWidget::selectionChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(QDate )>(_a, &QCalendarWidget::clicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(QDate )>(_a, &QCalendarWidget::activated, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(int , int )>(_a, &QCalendarWidget::currentPageChanged, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDate*>(_v) = _t->selectedDate(); break;
        case 1: *reinterpret_cast<QDate*>(_v) = _t->minimumDate(); break;
        case 2: *reinterpret_cast<QDate*>(_v) = _t->maximumDate(); break;
        case 3: *reinterpret_cast<Qt::DayOfWeek*>(_v) = _t->firstDayOfWeek(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isGridVisible(); break;
        case 5: *reinterpret_cast<SelectionMode*>(_v) = _t->selectionMode(); break;
        case 6: *reinterpret_cast<HorizontalHeaderFormat*>(_v) = _t->horizontalHeaderFormat(); break;
        case 7: *reinterpret_cast<VerticalHeaderFormat*>(_v) = _t->verticalHeaderFormat(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isNavigationBarVisible(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isDateEditEnabled(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->dateEditAcceptDelay(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSelectedDate(*reinterpret_cast<QDate*>(_v)); break;
        case 1: _t->setMinimumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 2: _t->setMaximumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 3: _t->setFirstDayOfWeek(*reinterpret_cast<Qt::DayOfWeek*>(_v)); break;
        case 4: _t->setGridVisible(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setSelectionMode(*reinterpret_cast<SelectionMode*>(_v)); break;
        case 6: _t->setHorizontalHeaderFormat(*reinterpret_cast<HorizontalHeaderFormat*>(_v)); break;
        case 7: _t->setVerticalHeaderFormat(*reinterpret_cast<VerticalHeaderFormat*>(_v)); break;
        case 8: _t->setNavigationBarVisible(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setDateEditEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setDateEditAcceptDelay(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->clearMinimumDate(); break;
        case 2: _t->clearMaximumDate(); break;
        default: break;
        }
    }
}